

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O2

string * cmGraphVizWriter::PathSafeString(string *__return_storage_ptr__,string *str)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  int iVar4;
  const_iterator cVar5;
  size_type sVar6;
  initializer_list<char> __l;
  char c;
  undefined1 uStack_64;
  undefined1 local_63;
  allocator_type local_62;
  less<char> local_61;
  set<char,_std::less<char>,_std::allocator<char>_> extra_chars;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  _c = 0x2d2e;
  local_63 = 0x5f;
  __l._M_len = 3;
  __l._M_array = &c;
  std::set<char,_std::less<char>,_std::allocator<char>_>::set(&extra_chars,__l,&local_61,&local_62);
  pcVar2 = (str->_M_dataplus)._M_p;
  sVar3 = str->_M_string_length;
  for (sVar6 = 0; sVar3 != sVar6; sVar6 = sVar6 + 1) {
    cVar1 = pcVar2[sVar6];
    _c = CONCAT11(uStack_64,cVar1);
    iVar4 = isalnum((int)cVar1);
    if ((iVar4 != 0) ||
       (cVar5 = std::
                _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
                find(&extra_chars._M_t,&c),
       (_Rb_tree_header *)cVar5._M_node != &extra_chars._M_t._M_impl.super__Rb_tree_header)) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::~_Rb_tree
            (&extra_chars._M_t);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGraphVizWriter::PathSafeString(std::string const& str)
{
  std::string pathSafeStr;

  // We'll only keep alphanumerical characters, plus the following ones that
  // are common, and safe on all platforms:
  auto const extra_chars = std::set<char>{ '.', '-', '_' };

  for (char c : str) {
    if (std::isalnum(c) || extra_chars.find(c) != extra_chars.cend()) {
      pathSafeStr += c;
    }
  }

  return pathSafeStr;
}